

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.cpp
# Opt level: O2

void __thiscall
atoiTest_testUint64OutOfBoundsHigh_Test::TestBody(atoiTest_testUint64OutOfBoundsHigh_Test *this)

{
  allocator local_29;
  string local_28;
  
  std::__cxx11::string::string((string *)&local_28,"18446744073709551616",&local_29);
  test<unsigned_long>(false,&local_28);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_28,"118446744073709551612",&local_29);
  test<unsigned_long>(false,&local_28);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string
            ((string *)&local_28,"1111111111111111111111111111111111111",&local_29);
  test<unsigned_long>(false,&local_28);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string
            ((string *)&local_28,"1111111111111111111111111111111111111111111111111111111111111",
             &local_29);
  test<unsigned_long>(false,&local_28);
  std::__cxx11::string::~string((string *)&local_28);
  return;
}

Assistant:

TEST(atoiTest, testUint64OutOfBoundsHigh) {
  // out of bounds
  test<uint64_t>(false, "18446744073709551616");
  test<uint64_t>(false, "118446744073709551612");
  test<uint64_t>(false, "1111111111111111111111111111111111111");
  test<uint64_t>(false, "1111111111111111111111111111111111111111111111111111111111111");
}